

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Ay_Emu::load_mem_(Ay_Emu *this,byte_ *in,long size)

{
  long in_RDX;
  Classic_Emu *in_RSI;
  Ay_Apu *in_RDI;
  blargg_err_t blargg_return_err_;
  file_t *in_stack_ffffffffffffffc8;
  imp_t *v;
  byte_ *in_stack_ffffffffffffffd8;
  blargg_err_t local_8;
  
  local_8 = parse_header(in_stack_ffffffffffffffd8,(long)in_RDI,in_stack_ffffffffffffffc8);
  if (local_8 == (blargg_err_t)0x0) {
    Gme_File::set_track_count
              ((Gme_File *)in_RDI,*(byte *)(*(long *)((in_RDI->synth_).impulses + 0xf0) + 0x10) + 1)
    ;
    if (2 < *(byte *)(*(long *)((in_RDI->synth_).impulses + 0xf0) + 8)) {
      Gme_File::set_warning((Gme_File *)in_RDI,"Unknown file version");
    }
    Music_Emu::set_voice_count((Music_Emu *)in_RDI,4);
    v = in_RDI[0x32].synth_.impulses + 0x60;
    Music_Emu::gain((Music_Emu *)in_RDI);
    Ay_Apu::volume(in_RDI,(double)v);
    local_8 = Classic_Emu::setup_buffer(in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

blargg_err_t Ay_Emu::load_mem_( byte const* in, long size )
{
	assert( offsetof (header_t,track_info [2]) == header_size );
	
	RETURN_ERR( parse_header( in, size, &file ) );
	set_track_count( file.header->max_track + 1 );
	
	if ( file.header->vers > 2 )
		set_warning( "Unknown file version" );
	
	set_voice_count( osc_count );
	apu.volume( gain() );
	
	return setup_buffer( spectrum_clock );
}